

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::ArgSortLayerParams::SharedCtor(ArgSortLayerParams *this)

{
  this->axis_ = 0;
  this->descending_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ArgSortLayerParams::SharedCtor() {
  ::memset(&axis_, 0, reinterpret_cast<char*>(&descending_) -
    reinterpret_cast<char*>(&axis_) + sizeof(descending_));
  _cached_size_ = 0;
}